

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O0

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  secp256k1_fe neg_y_1;
  uint index_1;
  uint negative_1;
  uint m_1;
  secp256k1_fe neg_y;
  uint index;
  uint negative;
  uint m;
  int j;
  secp256k1_ge t;
  uint bits2;
  uint bits1;
  int i;
  int group;
  secp256k1_fe global_z;
  secp256k1_ge pre_a_lam [4];
  secp256k1_ge pre_a [4];
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_scalar s;
  uint in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb6c;
  uint in_stack_fffffffffffffb70;
  uint in_stack_fffffffffffffb74;
  secp256k1_scalar *in_stack_fffffffffffffb78;
  uint local_454;
  uint local_418;
  int local_414;
  undefined1 local_410 [8];
  secp256k1_gej *in_stack_fffffffffffffbf8;
  secp256k1_gej *in_stack_fffffffffffffc00;
  secp256k1_gej *in_stack_fffffffffffffc20;
  secp256k1_fe *in_stack_fffffffffffffc28;
  secp256k1_ge *in_stack_fffffffffffffc30;
  int local_3a0;
  int local_39c;
  undefined1 local_368 [48];
  undefined1 auStack_338 [280];
  secp256k1_ge *in_stack_fffffffffffffde0;
  secp256k1_gej *in_stack_fffffffffffffde8;
  secp256k1_gej *in_stack_fffffffffffffdf0;
  undefined1 local_1c8 [48];
  undefined1 auStack_198 [408];
  
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x12406c);
  if (iVar1 == 0) {
    secp256k1_scalar_add
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (secp256k1_scalar *)0x12409f);
    secp256k1_scalar_half
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    secp256k1_scalar_split_lambda
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (secp256k1_scalar *)0x1240cc);
    secp256k1_scalar_add
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (secp256k1_scalar *)0x1240e3);
    secp256k1_scalar_add
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (secp256k1_scalar *)0x1240fa);
    for (local_3a0 = 0x81; local_3a0 < 0x100; local_3a0 = local_3a0 + 1) {
      uVar2 = secp256k1_scalar_get_bits_limb32
                        (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                         in_stack_fffffffffffffb70);
      if (uVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0xd9,"test condition failed: secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0");
        abort();
      }
      uVar2 = secp256k1_scalar_get_bits_limb32
                        (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                         in_stack_fffffffffffffb70);
      if (uVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0xda,"test condition failed: secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0");
        abort();
      }
    }
    secp256k1_gej_set_ge
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    secp256k1_ecmult_const_odd_multiples_table_globalz
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    for (local_3a0 = 0; local_3a0 < 4; local_3a0 = local_3a0 + 1) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    }
    for (local_39c = 0x2a; -1 < local_39c; local_39c = local_39c + -1) {
      uVar2 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68);
      uVar3 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68);
      if (7 < uVar2) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0xfb,"test condition failed: (bits1) < (1U << ECMULT_CONST_GROUP_SIZE)");
        abort();
      }
      if (3 < ((-(uVar2 >> 2 ^ 1) ^ uVar2) & 3)) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0xfb,"test condition failed: index < (1U << (ECMULT_CONST_GROUP_SIZE - 1))");
        abort();
      }
      memcpy(local_410,local_1c8,0x30);
      memcpy(&stack0xfffffffffffffc20,auStack_198,0x30);
      for (local_418 = 1; local_418 < 4; local_418 = local_418 + 1) {
        secp256k1_fe_cmov((secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                          (secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
        secp256k1_fe_cmov((secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                          (secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      }
      secp256k1_fe_negate_unchecked
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      secp256k1_fe_cmov((secp256k1_fe *)
                        CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                        (secp256k1_fe *)
                        CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      if (local_39c == 0x2a) {
        secp256k1_gej_set_ge
                  ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      }
      else {
        for (local_414 = 0; local_414 < 3; local_414 = local_414 + 1) {
          secp256k1_gej_double(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        }
        secp256k1_gej_add_ge
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      }
      if (7 < uVar3) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0x106,"test condition failed: (bits2) < (1U << ECMULT_CONST_GROUP_SIZE)");
        abort();
      }
      if (3 < ((-(uVar3 >> 2 ^ 1) ^ uVar3) & 3)) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
                ,0x106,"test condition failed: index < (1U << (ECMULT_CONST_GROUP_SIZE - 1))");
        abort();
      }
      memcpy(local_410,local_368,0x30);
      memcpy(&stack0xfffffffffffffc20,auStack_338,0x30);
      for (local_454 = 1; local_454 < 4; local_454 = local_454 + 1) {
        secp256k1_fe_cmov((secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                          (secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
        secp256k1_fe_cmov((secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                          (secp256k1_fe *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      }
      secp256k1_fe_negate_unchecked
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      secp256k1_fe_cmov((secp256k1_fe *)
                        CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                        (secp256k1_fe *)
                        CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0);
      secp256k1_gej_add_ge
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    }
    secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (secp256k1_fe *)0x1247a5);
  }
  else {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x12407e);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}